

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O0

int __thiscall ReadData::ReadRefPos(ReadData *this,BUFF *socketdata,uchar *HeadBuff)

{
  code *pcVar1;
  bool bVar2;
  uchar *Message;
  ulong uVar3;
  double dVar4;
  char *buff;
  uchar *HeadBuff_local;
  BUFF *socketdata_local;
  ReadData *this_local;
  
  if ((this->Head).MessageID == 0x2f) {
    uVar3 = (ulong)((this->Head).MessageLength + 4);
    if ((long)uVar3 < 0) {
      uVar3 = 0xffffffffffffffff;
    }
    Message = (uchar *)operator_new__(uVar3);
    if (socketdata->len - socketdata->pos < (this->Head).MessageLength) {
      socketdata->pos = socketdata->pos + -0x1c;
      this_local._4_4_ = 2;
    }
    else {
      memcpy(Message,socketdata->buff + socketdata->pos,(long)((this->Head).MessageLength + 4));
      socketdata->pos = (this->Head).MessageLength + 4 + socketdata->pos;
      bVar2 = CRCCheck(HeadBuff,Message,(this->Head).MessageLength,(this->Head).MessageLength);
      if (bVar2) {
        dVar4 = C2D((char *)(Message + 8),8);
        (this->UserPsrPos).B = dVar4;
        dVar4 = C2D((char *)(Message + 0x10),8);
        (this->UserPsrPos).L = dVar4;
        dVar4 = C2D((char *)(Message + 0x18),8);
        (this->UserPsrPos).H = dVar4;
        if (Message != (uchar *)0x0) {
          operator_delete__(Message);
        }
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      if (Message != (uchar *)0x0) {
        operator_delete__(Message);
      }
      this_local._4_4_ = 3;
    }
  }
  else {
    this_local._4_4_ = 6;
  }
  return this_local._4_4_;
}

Assistant:

int ReadData::ReadRefPos(BUFF &socketdata, unsigned char* HeadBuff) {
    if(Head.MessageID != 47)
        return CONFLICT_ID;
    
    char* buff = new char [Head.MessageLength + 4];
    if(socketdata.len - socketdata.pos < Head.MessageLength) {
        socketdata.pos -= 28;
        return FILE_OR_BUFF_END;
    }
    memcpy(buff, socketdata.buff + socketdata.pos, Head.MessageLength + 4);
    socketdata.pos += Head.MessageLength + 4;
    if(!CRCCheck(HeadBuff, (unsigned char*)buff, Head.MessageLength, Head.MessageLength)) {
        delete[] buff;
        return CRC_FAILED;
    }

    try {
        UserPsrPos.B = C2D(buff + 8, 8);
        UserPsrPos.L = C2D(buff + 16, 8);
        UserPsrPos.H = C2D(buff + 24, 8);
    } 
    catch(...) {
        cout << "error happened when reading GPS ehpe" << endl;
        return UNKNOWN_ERROR;
    }
    
    delete [] buff;  
}